

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LogMessage local_90;
  string local_58;
  LogFinisher local_31;
  ulong value;
  
  iVar2 = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var,iVar2);
  if ((value & 0xffffffff80000000) == 0) {
    iVar2 = io::CodedOutputStream::ByteCount(output);
    iVar3 = (*this->_vptr_MessageLite[0xc])(this,output->cur_,output);
    output->cur_ = (uint8 *)CONCAT44(extraout_var_00,iVar3);
    bVar1 = io::CodedOutputStream::HadError(output);
    if (!bVar1) {
      iVar3 = io::CodedOutputStream::ByteCount(output);
      if (value != (long)(iVar3 - iVar2)) {
        iVar2 = (*this->_vptr_MessageLite[9])(this);
        if (value != CONCAT44(extraout_var_01,iVar2)) {
          internal::LogMessage::LogMessage
                    (&local_90,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
                     ,0x54);
          pLVar4 = internal::LogMessage::operator<<
                             (&local_90,
                              "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                             );
          (*this->_vptr_MessageLite[2])(&local_58,this);
          pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_58);
          pLVar4 = internal::LogMessage::operator<<
                             (pLVar4," was modified concurrently during serialization.");
          internal::LogFinisher::operator=(&local_31,pLVar4);
          std::__cxx11::string::~string((string *)&local_58);
          internal::LogMessage::~LogMessage(&local_90);
        }
        internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
                   ,0x57);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_90,
                            "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                           );
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,
                            "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                           );
        (*this->_vptr_MessageLite[2])(&local_58,this);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_58);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,".");
        internal::LogFinisher::operator=(&local_31,pLVar4);
        std::__cxx11::string::~string((string *)&local_58);
        internal::LogMessage::~LogMessage(&local_90);
        internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
                   ,0x5c);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_90,"This shouldn\'t be called if all the sizes are equal.");
        internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar4);
        internal::LogMessage::~LogMessage(&local_90);
      }
    }
    bVar1 = !bVar1;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
               ,0x17c);
    (*this->_vptr_MessageLite[2])(&local_58,this);
    pLVar4 = internal::LogMessage::operator<<(&local_90,&local_58);
    pLVar4 = internal::LogMessage::operator<<(pLVar4," exceeded maximum protobuf size of 2GB: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    internal::LogFinisher::operator=(&local_31,pLVar4);
    std::__cxx11::string::~string((string *)&local_58);
    internal::LogMessage::~LogMessage(&local_90);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != size) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}